

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error compute_glyph_metrics(TT_Loader loader,FT_UInt glyph_index)

{
  TT_Face face_00;
  FT_GlyphSlot pFVar1;
  TT_Size pTVar2;
  int iVar3;
  FT_Error FVar4;
  FT_Int32 FVar5;
  byte *pbVar6;
  FT_Long FVar7;
  ulong uVar8;
  undefined1 auStack_b0 [4];
  FT_Error error;
  FT_Incremental_MetricsRec incr_metrics;
  FT_Incremental_InterfaceRec *incr;
  FT_Pos height;
  FT_Pos advance;
  FT_Pos top;
  FT_Byte *widthp;
  TT_Size size;
  TT_GlyphSlot glyph;
  FT_Fixed y_scale;
  FT_BBox bbox;
  TT_Driver driver;
  TT_Face face;
  FT_UInt glyph_index_local;
  TT_Loader loader_local;
  
  face_00 = loader->face;
  bbox.yMax = (FT_Pos)(face_00->root).driver;
  pFVar1 = loader->glyph;
  pTVar2 = loader->size;
  glyph = (TT_GlyphSlot)0x10000;
  if ((loader->load_flags & 1) == 0) {
    glyph = (TT_GlyphSlot)pTVar2->metrics->y_scale;
  }
  if (pFVar1->format == FT_GLYPH_FORMAT_COMPOSITE) {
    y_scale = (loader->bbox).xMin;
    bbox.xMin = (loader->bbox).yMin;
    bbox.yMin = (loader->bbox).xMax;
    bbox.xMax = (loader->bbox).yMax;
  }
  else {
    FT_Outline_Get_CBox(&pFVar1->outline,(FT_BBox *)&y_scale);
  }
  pFVar1->linearHoriAdvance = (long)loader->linear;
  (pFVar1->metrics).horiBearingX = y_scale;
  (pFVar1->metrics).horiBearingY = bbox.xMax;
  (pFVar1->metrics).horiAdvance = (loader->pp2).x - (loader->pp1).x;
  if (((((*(int *)(bbox.yMax + 0x78) != 0x28) || (loader->exec == (TT_ExecContext)0x0)) ||
       (loader->exec->backward_compatibility == '\0')) &&
      (((face_00->postscript).isFixedPitch == 0 && ((loader->load_flags & 2) == 0)))) &&
     (((loader->load_flags & 0x200000) == 0 &&
      (pbVar6 = tt_face_get_device_metrics(face_00,(uint)pTVar2->metrics->x_ppem,glyph_index),
      pbVar6 != (byte *)0x0)))) {
    (pFVar1->metrics).horiAdvance = (long)(int)((uint)*pbVar6 << 6);
  }
  (pFVar1->metrics).width = bbox.yMin - y_scale;
  (pFVar1->metrics).height = bbox.xMax - bbox.xMin;
  if ((face_00->vertical_info == '\0') || ((face_00->vertical).number_Of_VMetrics == 0)) {
    FVar7 = FT_DivFix(bbox.xMax - bbox.xMin,(FT_Long)glyph);
    if ((face_00->os2).version == 0xffff) {
      iVar3 = (int)(face_00->horizontal).Ascender - (int)(face_00->horizontal).Descender;
    }
    else {
      iVar3 = (int)(face_00->os2).sTypoAscender - (int)(face_00->os2).sTypoDescender;
    }
    height = (FT_Pos)iVar3;
    advance = (height - (short)FVar7) / 2;
  }
  else {
    FVar7 = FT_DivFix((loader->pp3).y - bbox.xMax,(FT_Long)glyph);
    advance = (FT_Pos)(short)FVar7;
    if ((loader->pp4).y < (loader->pp3).y) {
      uVar8 = FT_DivFix((loader->pp3).y - (loader->pp4).y,(FT_Long)glyph);
      height = uVar8 & 0xffff;
    }
    else {
      height = 0;
    }
  }
  incr_metrics.advance_v = (FT_Long)((face_00->root).internal)->incremental_interface;
  if (((FT_Incremental_InterfaceRec *)incr_metrics.advance_v != (FT_Incremental_InterfaceRec *)0x0)
     && (((FT_Incremental_InterfaceRec *)incr_metrics.advance_v)->funcs->get_glyph_metrics !=
         (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
    _auStack_b0 = 0;
    incr_metrics.bearing_x = advance;
    incr_metrics.bearing_y = height;
    FVar4 = (*((FT_Incremental_InterfaceRec *)incr_metrics.advance_v)->funcs->get_glyph_metrics)
                      (((FT_Incremental_InterfaceRec *)incr_metrics.advance_v)->object,glyph_index,
                       '\x01',(FT_Incremental_MetricsRec *)auStack_b0);
    if (FVar4 != 0) {
      return FVar4;
    }
    advance = incr_metrics.bearing_x;
    height = incr_metrics.bearing_y;
  }
  pFVar1->linearVertAdvance = height;
  if ((loader->load_flags & 1) == 0) {
    FVar5 = FT_MulFix_x86_64((FT_Int32)advance,(FT_Int32)glyph);
    advance = (FT_Pos)FVar5;
    FVar5 = FT_MulFix_x86_64((FT_Int32)height,(FT_Int32)glyph);
    height = (FT_Pos)FVar5;
  }
  (pFVar1->metrics).vertBearingX =
       (pFVar1->metrics).horiBearingX - (pFVar1->metrics).horiAdvance / 2;
  (pFVar1->metrics).vertBearingY = advance;
  (pFVar1->metrics).vertAdvance = height;
  return 0;
}

Assistant:

static FT_Error
  compute_glyph_metrics( TT_Loader  loader,
                         FT_UInt    glyph_index )
  {
    TT_Face    face   = loader->face;
#if defined TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY || \
    defined TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( face );
#endif

    FT_BBox       bbox;
    FT_Fixed      y_scale;
    TT_GlyphSlot  glyph = loader->glyph;
    TT_Size       size  = loader->size;


    y_scale = 0x10000L;
    if ( ( loader->load_flags & FT_LOAD_NO_SCALE ) == 0 )
      y_scale = size->metrics->y_scale;

    if ( glyph->format != FT_GLYPH_FORMAT_COMPOSITE )
      FT_Outline_Get_CBox( &glyph->outline, &bbox );
    else
      bbox = loader->bbox;

    /* get the device-independent horizontal advance; it is scaled later */
    /* by the base layer.                                                */
    glyph->linearHoriAdvance = loader->linear;

    glyph->metrics.horiBearingX = bbox.xMin;
    glyph->metrics.horiBearingY = bbox.yMax;
    glyph->metrics.horiAdvance  = loader->pp2.x - loader->pp1.x;

    /* Adjust advance width to the value contained in the hdmx table   */
    /* unless FT_LOAD_COMPUTE_METRICS is set or backward compatibility */
    /* mode of the v40 interpreter is active.  See `ttinterp.h' for    */
    /* details on backward compatibility mode.                         */
    if (
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
         !( driver->interpreter_version == TT_INTERPRETER_VERSION_40  &&
            ( loader->exec && loader->exec->backward_compatibility  ) ) &&
#endif
         !face->postscript.isFixedPitch                                 &&
         IS_HINTED( loader->load_flags )                                &&
         !( loader->load_flags & FT_LOAD_COMPUTE_METRICS )              )
    {
      FT_Byte*  widthp;


      widthp = tt_face_get_device_metrics( face,
                                           size->metrics->x_ppem,
                                           glyph_index );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY

      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 )
      {
        FT_Bool  ignore_x_mode;


        ignore_x_mode = FT_BOOL( FT_LOAD_TARGET_MODE( loader->load_flags ) !=
                                 FT_RENDER_MODE_MONO );

        if ( widthp                                                   &&
             ( ( ignore_x_mode && loader->exec->compatible_widths ) ||
                !ignore_x_mode                                      ||
                SPH_OPTION_BITMAP_WIDTHS                            ) )
          glyph->metrics.horiAdvance = *widthp * 64;
      }
      else

#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      {
        if ( widthp )
          glyph->metrics.horiAdvance = *widthp * 64;
      }
    }